

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O2

uint Validator::constraintS7(Solution *solution)

{
  int iVar1;
  int iVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_NurseSolution_*>_>_>
  *pmVar3;
  Nurse *pNVar4;
  History *this;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar5;
  vector<Turn_*,_std::allocator<Turn_*>_> *pvVar6;
  Scenario *pSVar7;
  string *psVar8;
  _Base_ptr p_Var9;
  uint local_b4;
  string local_b0;
  string local_90;
  Contract local_70;
  
  pmVar3 = Solution::getNurses_abi_cxx11_(solution);
  p_Var9 = (pmVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b4 = 0;
  do {
    if ((_Rb_tree_header *)p_Var9 == &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
      return local_b4;
    }
    pNVar4 = NurseSolution::getNurse(*(NurseSolution **)(p_Var9 + 2));
    this = Nurse::getHistory(pNVar4);
    iVar1 = History::getNumberOfWorkingWeekends(this);
    pvVar5 = NurseSolution::getTurns(*(NurseSolution **)(p_Var9 + 2));
    if ((pvVar5->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar5->super__Vector_base<Turn_*,_std::allocator<Turn_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      pvVar5 = NurseSolution::getTurns(*(NurseSolution **)(p_Var9 + 2));
      pvVar6 = NurseSolution::getTurns(*(NurseSolution **)(p_Var9 + 2));
      iVar2 = Turn::getDay(*(Turn **)((long)(pvVar6->
                                            super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                            _M_impl.super__Vector_impl_data._M_finish +
                                     (long)(pvVar5->
                                           super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                           _M_impl.super__Vector_impl_data._M_start +
                                     (-8 - (long)(pvVar6->
                                                 super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                 )._M_impl.super__Vector_impl_data._M_start)));
      if (iVar2 != 6) {
        pvVar5 = NurseSolution::getTurns(*(NurseSolution **)(p_Var9 + 2));
        pvVar6 = NurseSolution::getTurns(*(NurseSolution **)(p_Var9 + 2));
        iVar2 = Turn::getDay(*(Turn **)((long)(pvVar6->
                                              super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                              _M_impl.super__Vector_impl_data._M_finish +
                                       (long)(pvVar5->
                                             super__Vector_base<Turn_*,_std::allocator<Turn_*>_>).
                                             _M_impl.super__Vector_impl_data._M_start +
                                       (-8 - (long)(pvVar6->
                                                  super__Vector_base<Turn_*,_std::allocator<Turn_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)));
        if (iVar2 != 5) goto LAB_00111fcc;
      }
      iVar1 = iVar1 + 1;
    }
LAB_00111fcc:
    pSVar7 = Scenario::getInstance();
    pNVar4 = NurseSolution::getNurse(*(NurseSolution **)(p_Var9 + 2));
    psVar8 = Nurse::getContract_abi_cxx11_(pNVar4);
    std::__cxx11::string::string((string *)&local_90,(string *)psVar8);
    Scenario::getContract(&local_70,pSVar7,&local_90);
    iVar2 = Contract::getMaximumNumberOfWorkingWeekends(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    if (iVar2 < iVar1) {
      pSVar7 = Scenario::getInstance();
      pNVar4 = NurseSolution::getNurse(*(NurseSolution **)(p_Var9 + 2));
      psVar8 = Nurse::getContract_abi_cxx11_(pNVar4);
      std::__cxx11::string::string((string *)&local_b0,(string *)psVar8);
      Scenario::getContract(&local_70,pSVar7,&local_b0);
      iVar2 = Contract::getMaximumNumberOfWorkingWeekends(&local_70);
      local_b4 = local_b4 + (iVar1 - iVar2) * 0x1e;
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
  } while( true );
}

Assistant:

unsigned int Validator::constraintS7(const Solution &solution){

    unsigned int sum = 0;

    for(auto const &nurse : solution.getNurses())
    {
        int numberOfWorkingWeekends = nurse.second->getNurse()->getHistory().getNumberOfWorkingWeekends();


        if(nurse.second->getTurns().size() > 0)
            if(nurse.second->getTurns()[nurse.second->getTurns().size() - 1]->getDay() == 6 || nurse.second->getTurns()[nurse.second->getTurns().size() - 1]->getDay() == 5)
                numberOfWorkingWeekends++;

        if(numberOfWorkingWeekends > Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfWorkingWeekends())
            sum += 30 * (numberOfWorkingWeekends - Scenario::getInstance()->getContract(nurse.second->getNurse()->getContract()).getMaximumNumberOfWorkingWeekends());

    }
    return sum;
}